

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

double embree::compareImages(Ref<embree::Image> *image0,Ref<embree::Image> *image1)

{
  double dVar1;
  long *in_RSI;
  long *in_RDI;
  Color c1;
  Color c0;
  size_t x;
  size_t y;
  double diff;
  size_t height;
  size_t width;
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  undefined4 uStack_bc;
  ulong local_b0;
  ulong local_a8;
  double local_a0;
  ulong local_98;
  ulong local_90;
  double local_78;
  undefined1 *local_40;
  undefined1 *local_38;
  float *local_30;
  float *local_28;
  undefined1 *local_20;
  float *local_18;
  float local_c;
  float local_8;
  float local_4;
  
  local_90 = *(ulong *)(*in_RDI + 0x10);
  local_98 = *(ulong *)(*in_RDI + 0x18);
  if (*(ulong *)(*in_RSI + 0x10) == local_90) {
    if (*(ulong *)(*in_RSI + 0x18) == local_98) {
      local_a0 = 0.0;
      for (local_a8 = 0; local_a8 < local_98; local_a8 = local_a8 + 1) {
        for (local_b0 = 0; local_b0 < local_90; local_b0 = local_b0 + 1) {
          (**(code **)(*(long *)*in_RDI + 0x20))(&local_d8,(long *)*in_RDI,local_b0,local_a8);
          local_28 = &local_c8;
          local_30 = &local_d8;
          local_c8 = local_d8;
          fStack_c4 = fStack_d4;
          fStack_c0 = fStack_d0;
          uStack_bc = uStack_cc;
          (**(code **)(*(long *)*in_RSI + 0x20))(local_f8,(long *)*in_RSI,local_b0,local_a8);
          local_18 = &local_e8;
          local_20 = local_f8;
          fStack_e4 = SUB84(local_f8._0_8_,4);
          local_e8 = (float)local_f8._0_8_;
          fStack_e0 = (float)local_f8._8_8_;
          dVar1 = std::fabs((double)(ulong)(uint)(local_c8 - local_e8));
          local_4 = SUB84(dVar1,0);
          local_a0 = (double)((local_4 * local_4) / 3.0) + local_a0;
          dVar1 = std::fabs((double)(ulong)(uint)(fStack_c4 - fStack_e4));
          local_8 = SUB84(dVar1,0);
          local_a0 = (double)((local_8 * local_8) / 3.0) + local_a0;
          dVar1 = std::fabs((double)(ulong)(uint)(fStack_c0 - fStack_e0));
          local_c = SUB84(dVar1,0);
          local_a0 = (double)((local_c * local_c) / 3.0) + local_a0;
        }
      }
      local_78 = local_a0;
    }
    else {
      local_40 = &inf;
      local_78 = std::numeric_limits<double>::infinity();
    }
  }
  else {
    local_38 = &inf;
    local_78 = std::numeric_limits<double>::infinity();
  }
  return local_78;
}

Assistant:

double compareImages(Ref<Image> image0, Ref<Image> image1)
  {
    /* compare image size */
    const size_t width = image0->width;
    const size_t height = image0->height;
    if (image1->width != width) return inf;
    if (image1->height != height) return inf;

    /* compare both images */
    double diff = 0.0;
    for (size_t y=0; y<height; y++)
    {
      for (size_t x=0; x<width; x++)
      {
        const Color c0 = image0->get(x,y);
        const Color c1 = image1->get(x,y);
        diff += sqr(fabs(c0.r - c1.r))/3.0f;
        diff += sqr(fabs(c0.g - c1.g))/3.0f;
        diff += sqr(fabs(c0.b - c1.b))/3.0f;
      }
    }

    return diff;
  }